

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode
XXH3_update(XXH3_state_t *state,xxh_u8 *input,size_t len,XXH3_f_accumulate_512 f_acc512,
           XXH3_f_scrambleAcc f_scramble)

{
  XXH3_f_scrambleAcc p_Var1;
  xxh_u64 *input_00;
  code *nbStripesPerBlock;
  code *pcVar2;
  XXH3_f_accumulate_512 in_RCX;
  XXH3_f_scrambleAcc in_RDX;
  code *in_RSI;
  long in_RDI;
  xxh_u8 *in_R8;
  xxh_u8 *limit;
  size_t loadSize;
  uchar *secret;
  xxh_u8 *bEnd;
  XXH3_f_accumulate_512 in_stack_ffffffffffffff90;
  xxh_u8 *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  xxh_u64 *acc;
  code *local_18;
  XXH_errorcode local_4;
  
  if (in_RSI == (code *)0x0) {
    local_4 = XXH_ERROR;
  }
  else {
    p_Var1 = in_RSI + (long)in_RDX;
    if (*(long *)(in_RDI + 0x238) == 0) {
      input_00 = (xxh_u64 *)(in_RDI + 0x40);
    }
    else {
      input_00 = *(xxh_u64 **)(in_RDI + 0x238);
    }
    *(XXH3_f_scrambleAcc *)(in_RDI + 0x210) = in_RDX + *(long *)(in_RDI + 0x210);
    if (in_RDX + *(uint *)(in_RDI + 0x200) < (XXH3_f_scrambleAcc)0x101) {
      XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (size_t)in_stack_ffffffffffffff90);
      *(int *)(in_RDI + 0x200) = (int)in_RDX + *(int *)(in_RDI + 0x200);
      local_4 = XXH_OK;
    }
    else {
      acc = input_00;
      local_18 = in_RSI;
      if (*(int *)(in_RDI + 0x200) != 0) {
        in_stack_ffffffffffffffb8 = (size_t *)(ulong)(0x100 - *(int *)(in_RDI + 0x200));
        XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (size_t)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff90 = in_RCX;
        in_stack_ffffffffffffff98 = in_R8;
        local_18 = (code *)((long)in_stack_ffffffffffffffb8 + (long)in_RSI);
        in_R8 = in_stack_ffffffffffffff98;
        in_RCX = in_stack_ffffffffffffff90;
        XXH3_consumeStripes(acc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            (xxh_u8 *)input_00,(size_t)in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,in_RDX);
        *(undefined4 *)(in_RDI + 0x200) = 0;
      }
      if (local_18 + 0x100 < p_Var1) {
        nbStripesPerBlock = p_Var1 + 0xffffffffffffff00;
        pcVar2 = local_18;
        do {
          local_18 = pcVar2;
          in_stack_ffffffffffffff90 = in_RCX;
          in_stack_ffffffffffffff98 = in_R8;
          in_R8 = in_stack_ffffffffffffff98;
          in_RCX = in_stack_ffffffffffffff90;
          XXH3_consumeStripes(acc,in_stack_ffffffffffffffb8,(size_t)nbStripesPerBlock,
                              (xxh_u8 *)input_00,(size_t)in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,in_RDX);
          pcVar2 = local_18 + 0x100;
        } while (pcVar2 < nbStripesPerBlock);
        memcpy((void *)(in_RDI + 0x1c0),local_18 + 0xc0,0x40);
        local_18 = pcVar2;
      }
      XXH_memcpy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (size_t)in_stack_ffffffffffffff90);
      *(int *)(in_RDI + 0x200) = (int)p_Var1 - (int)local_18;
      local_4 = XXH_OK;
    }
  }
  return local_4;
}

Assistant:

XXH_FORCE_INLINE XXH_errorcode
XXH3_update(XXH3_state_t* state,
            const xxh_u8* input, size_t len,
            XXH3_f_accumulate_512 f_acc512,
            XXH3_f_scrambleAcc f_scramble)
{
    if (input==NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && (XXH_ACCEPT_NULL_INPUT_POINTER>=1)
        return XXH_OK;
#else
        return XXH_ERROR;
#endif

    {   const xxh_u8* const bEnd = input + len;
        const unsigned char* const secret = (state->extSecret == NULL) ? state->customSecret : state->extSecret;

        state->totalLen += len;
        XXH_ASSERT(state->bufferedSize <= XXH3_INTERNALBUFFER_SIZE);

        if (state->bufferedSize + len <= XXH3_INTERNALBUFFER_SIZE) {  /* fill in tmp buffer */
            XXH_memcpy(state->buffer + state->bufferedSize, input, len);
            state->bufferedSize += (XXH32_hash_t)len;
            return XXH_OK;
        }
        /* total input is now > XXH3_INTERNALBUFFER_SIZE */

        #define XXH3_INTERNALBUFFER_STRIPES (XXH3_INTERNALBUFFER_SIZE / XXH_STRIPE_LEN)
        XXH_STATIC_ASSERT(XXH3_INTERNALBUFFER_SIZE % XXH_STRIPE_LEN == 0);   /* clean multiple */

        /*
         * Internal buffer is partially filled (always, except at beginning)
         * Complete it, then consume it.
         */
        if (state->bufferedSize) {
            size_t const loadSize = XXH3_INTERNALBUFFER_SIZE - state->bufferedSize;
            XXH_memcpy(state->buffer + state->bufferedSize, input, loadSize);
            input += loadSize;
            XXH3_consumeStripes(state->acc,
                               &state->nbStripesSoFar, state->nbStripesPerBlock,
                                state->buffer, XXH3_INTERNALBUFFER_STRIPES,
                                secret, state->secretLimit,
                                f_acc512, f_scramble);
            state->bufferedSize = 0;
        }
        XXH_ASSERT(input < bEnd);

        /* Consume input by a multiple of internal buffer size */
        if (input+XXH3_INTERNALBUFFER_SIZE < bEnd) {
            const xxh_u8* const limit = bEnd - XXH3_INTERNALBUFFER_SIZE;
            do {
                XXH3_consumeStripes(state->acc,
                                   &state->nbStripesSoFar, state->nbStripesPerBlock,
                                    input, XXH3_INTERNALBUFFER_STRIPES,
                                    secret, state->secretLimit,
                                    f_acc512, f_scramble);
                input += XXH3_INTERNALBUFFER_SIZE;
            } while (input<limit);
            /* for last partial stripe */
            memcpy(state->buffer + sizeof(state->buffer) - XXH_STRIPE_LEN, input - XXH_STRIPE_LEN, XXH_STRIPE_LEN);
        }
        XXH_ASSERT(input < bEnd);

        /* Some remaining input (always) : buffer it */
        XXH_memcpy(state->buffer, input, (size_t)(bEnd-input));
        state->bufferedSize = (XXH32_hash_t)(bEnd-input);
    }

    return XXH_OK;
}